

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int arenas_lookup_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  ulong uVar1;
  ulong uVar2;
  arena_t *paVar3;
  uint *in_RCX;
  undefined8 in_RDX;
  uintptr_t in_RSI;
  rtree_ctx_t *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  long in_stack_00000008;
  size_t copylen;
  arena_t *arena;
  extent_t *extent;
  void *ptr;
  uint arena_ind;
  int ret;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm;
  uint8_t state;
  rtree_leaf_elm_t *elm_1;
  uintptr_t bits;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  void *result;
  size_t local_480;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  extent_t *in_stack_fffffffffffffb90;
  tsdn_t *in_stack_fffffffffffffb98;
  ulong local_448;
  uint local_440;
  int local_43c;
  ulong *local_438;
  ulong *local_430;
  uint *local_428;
  undefined2 uVar4;
  rtree_t *in_stack_fffffffffffffbf8;
  rtree_ctx_t *prVar5;
  rtree_ctx_t local_3e8;
  ulong local_268;
  rtree_ctx_t *local_260;
  rtree_ctx_t *local_258;
  rtree_ctx_t *local_248;
  extent_t *local_230;
  byte local_221;
  ulong local_220;
  rtree_ctx_t *local_218;
  rtree_t *local_210;
  rtree_ctx_t *local_208;
  ulong local_200;
  undefined1 local_1e9;
  extent_t *local_1d0;
  byte local_1c1;
  ulong local_1c0;
  rtree_ctx_t *local_1b8;
  rtree_t *local_1b0;
  rtree_ctx_t *local_1a8;
  extent_t *local_1a0;
  void *local_198;
  byte local_189;
  extent_t *local_188;
  rtree_t *local_180;
  rtree_ctx_t *local_178;
  ulong local_170;
  rtree_leaf_elm_t *local_168;
  uint local_15c;
  ulong local_158;
  rtree_leaf_elm_t *local_150;
  ulong local_148;
  rtree_leaf_elm_t *local_140;
  uintptr_t local_138;
  ulong local_130;
  undefined1 local_122;
  undefined1 local_121;
  ulong local_120;
  rtree_ctx_t *local_118;
  rtree_t *local_110;
  rtree_ctx_t *local_108;
  extent_t *local_100;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  ulong local_e8;
  undefined8 local_e0;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  ulong local_c8;
  undefined8 local_c0;
  uint local_b4;
  undefined4 local_b0;
  uint local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  ulong local_a0;
  undefined8 local_98;
  uint local_8c;
  undefined4 local_88;
  uint local_84;
  undefined4 local_80;
  undefined4 local_7c;
  ulong local_78;
  undefined8 local_70;
  uint local_64;
  undefined4 local_60;
  uint local_5c;
  undefined4 local_58;
  undefined4 local_54;
  ulong local_50;
  byte local_41;
  extent_t *local_40;
  rtree_t *local_38;
  rtree_ctx_t *local_30;
  void *local_28;
  uint local_1c;
  extent_t *local_18;
  uint local_10;
  int local_c;
  void *local_8;
  
  uVar4 = (undefined2)((ulong)in_RDX >> 0x30);
  local_448 = 0;
  local_43c = 0x16;
  local_438 = in_R9;
  local_430 = in_R8;
  local_428 = in_RCX;
  malloc_mutex_lock(in_stack_fffffffffffffb98,(malloc_mutex_t *)in_stack_fffffffffffffb90);
  if (local_438 != (ulong *)0x0) {
    if (in_stack_00000008 != 8) {
      local_43c = 0x16;
      goto LAB_0014ee14;
    }
    local_448 = *local_438;
  }
  local_268 = local_448;
  local_258 = &local_3e8;
  prVar5 = in_RDI;
  local_260 = in_RDI;
  if (in_RDI == (rtree_ctx_t *)0x0) {
    rtree_ctx_data_init(local_258);
    local_248 = local_258;
  }
  else {
    local_1e9 = (undefined1)in_RDI->cache[0].leafkey;
    local_248 = (rtree_ctx_t *)(in_RDI->cache + 3);
  }
  local_208 = local_260;
  local_210 = &extents_rtree;
  local_218 = local_248;
  local_220 = local_268;
  local_221 = 1;
  local_1a8 = local_260;
  local_1b0 = &extents_rtree;
  local_1b8 = local_248;
  local_1c0 = local_268;
  local_1c1 = 1;
  local_108 = local_260;
  local_110 = &extents_rtree;
  local_118 = local_248;
  local_120 = local_268;
  local_121 = 1;
  local_122 = 0;
  local_e8 = local_268;
  local_ec = 0x40;
  local_f0 = 0x22;
  local_f4 = 0x1e;
  uVar1 = local_268 >> 0x1e & 0xf;
  local_c8 = local_268;
  local_cc = 0x40;
  local_d0 = 0x22;
  local_d4 = 0x1e;
  local_e0 = 0xffffffffc0000000;
  uVar2 = local_268 & 0xffffffffc0000000;
  local_138 = uVar2;
  local_130 = uVar1;
  if (local_248->cache[uVar1].leafkey == uVar2) {
    local_140 = local_248->cache[uVar1].leaf;
    local_a0 = local_268;
    local_a4 = 1;
    local_a8 = 0x40;
    local_ac = 0x34;
    local_b0 = 0xc;
    local_b4 = 0x12;
    local_c0 = 0x3ffff;
    local_148 = local_268 >> 0xc & 0x3ffff;
    local_100 = (extent_t *)(local_140 + local_148);
  }
  else if (local_248->l2_cache[0].leafkey == uVar2) {
    local_150 = local_248->l2_cache[0].leaf;
    local_248->l2_cache[0].leafkey = local_248->cache[uVar1].leafkey;
    local_118->l2_cache[0].leaf = local_118->cache[local_130].leaf;
    local_118->cache[local_130].leafkey = local_138;
    local_118->cache[local_130].leaf = local_150;
    local_78 = local_120;
    local_7c = 1;
    local_80 = 0x40;
    local_84 = 0x34;
    local_88 = 0xc;
    local_8c = 0x12;
    local_98 = 0x3ffff;
    local_158 = local_120 >> 0xc & 0x3ffff;
    local_100 = (extent_t *)(local_150 + local_158);
  }
  else {
    for (local_15c = 1; local_15c < 8; local_15c = local_15c + 1) {
      if (local_248->l2_cache[local_15c].leafkey == uVar2) {
        local_168 = local_248->l2_cache[local_15c].leaf;
        if (local_15c == 0) {
          local_248->l2_cache[0].leafkey = local_248->cache[uVar1].leafkey;
          local_118->l2_cache[0].leaf = local_118->cache[local_130].leaf;
        }
        else {
          local_248->l2_cache[local_15c].leafkey = local_248->l2_cache[local_15c - 1].leafkey;
          local_248->l2_cache[local_15c].leaf = local_248->l2_cache[local_15c - 1].leaf;
          local_248->l2_cache[local_15c - 1].leafkey = local_248->cache[uVar1].leafkey;
          local_248->l2_cache[local_15c - 1].leaf = local_248->cache[uVar1].leaf;
        }
        local_118->cache[local_130].leafkey = local_138;
        local_118->cache[local_130].leaf = local_168;
        local_50 = local_120;
        local_54 = 1;
        local_58 = 0x40;
        local_5c = 0x34;
        local_60 = 0xc;
        local_64 = 0x12;
        local_70 = 0x3ffff;
        local_170 = local_120 >> 0xc & 0x3ffff;
        local_100 = (extent_t *)(local_168 + local_170);
        goto LAB_0014eb25;
      }
    }
    local_100 = (extent_t *)
                rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)prVar5,in_stack_fffffffffffffbf8,in_RDI,in_RSI,
                           SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
  }
LAB_0014eb25:
  local_1d0 = local_100;
  if (((local_1c1 & 1) == 0) && (local_100 == (extent_t *)0x0)) {
    local_1a0 = (extent_t *)0x0;
  }
  else {
    local_1a0 = local_100;
  }
  local_230 = local_1a0;
  if (((local_221 & 1) == 0) && (local_1a0 == (extent_t *)0x0)) {
    local_200 = 0;
  }
  else {
    local_178 = local_208;
    local_180 = local_210;
    local_188 = local_1a0;
    local_189 = local_221 & 1;
    local_30 = local_208;
    local_38 = local_210;
    local_40 = local_1a0;
    local_1c = (byte)~local_189 & 1;
    local_18 = local_1a0;
    switch(local_1c) {
    case 0:
      local_c = 0;
      break;
    case 1:
      local_c = 2;
    }
    if (local_c - 1U < 2) {
      local_28 = ((atomic_p_t *)&local_1a0->e_bits)->repr;
    }
    else if (local_c == 5) {
      local_28 = ((atomic_p_t *)&local_1a0->e_bits)->repr;
    }
    else {
      local_28 = ((atomic_p_t *)&local_1a0->e_bits)->repr;
    }
    local_198 = local_28;
    local_8 = local_28;
    local_200 = ((long)local_28 << 0x10) >> 0x10 & 0xfffffffffffffffe;
    in_stack_fffffffffffffb8c = local_c;
    in_stack_fffffffffffffb90 = local_1a0;
    local_41 = local_189;
    local_10 = local_1c;
  }
  if ((local_200 != 0) &&
     (paVar3 = extent_arena_get(in_stack_fffffffffffffb90), paVar3 != (arena_t *)0x0)) {
    local_440 = arena_ind_get((arena_t *)0x14ed90);
    if ((local_428 != (uint *)0x0) && (local_430 != (ulong *)0x0)) {
      if (*local_430 != 4) {
        if (*local_430 < 4) {
          local_480 = *local_430;
        }
        else {
          local_480 = 4;
        }
        memcpy(local_428,&local_440,local_480);
        local_43c = 0x16;
        goto LAB_0014ee14;
      }
      *local_428 = local_440;
    }
    local_43c = 0;
  }
LAB_0014ee14:
  malloc_mutex_unlock((tsdn_t *)in_stack_fffffffffffffb90,
                      (malloc_mutex_t *)
                      CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  return local_43c;
}

Assistant:

static int
arenas_lookup_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	void *ptr;
	extent_t *extent;
	arena_t *arena;

	ptr = NULL;
	ret = EINVAL;
	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(ptr, void *);
	extent = iealloc(tsd_tsdn(tsd), ptr);
	if (extent == NULL)
		goto label_return;

	arena = extent_arena_get(extent);
	if (arena == NULL)
		goto label_return;

	arena_ind = arena_ind_get(arena);
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}